

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::Unlock(CWallet *this,SecureString *strWalletPassphrase)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext;
  span<const_unsigned_char,_18446744073709551615UL> salt;
  bool bVar2;
  AnnotatedMixin<std::recursive_mutex> *pszFile;
  CWallet *this_00;
  CWallet *in_RSI;
  CCrypter *in_RDI;
  long in_FS_OFFSET;
  value_type *pMasterKey;
  MasterKeyMap *__range2;
  iterator __end2;
  iterator __begin2;
  CKeyingMaterial _vMasterKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  CCrypter crypter;
  CCrypter *in_stack_fffffffffffffef8;
  undefined5 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff05;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  CWallet *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar3;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff30;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff38;
  CWallet *this_01;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  SecureString *in_stack_ffffffffffffff48;
  CCrypter *this_02;
  byte local_99;
  pointer in_stack_ffffffffffffff68;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff70;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  CCrypter::CCrypter((CCrypter *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
            (&in_stack_fffffffffffffef8->vchKey);
  pszFile = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffef8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),(char *)pszFile,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  this_01 = (CWallet *)&in_RDI[9].vchIV;
  std::
  map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
  ::begin((map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
           *)CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))));
  std::
  map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
  ::end((map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
         *)CONCAT17(in_stack_ffffffffffffff07,
                    CONCAT16(in_stack_ffffffffffffff06,
                             CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))));
  do {
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff08,
                            (_Self *)CONCAT17(in_stack_ffffffffffffff07,
                                              CONCAT16(in_stack_ffffffffffffff06,
                                                       CONCAT15(in_stack_ffffffffffffff05,
                                                                in_stack_ffffffffffffff00))));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      iVar3 = 0;
LAB_00ad3818:
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffef8);
      if (iVar3 == 0) {
        local_99 = 0;
      }
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 in_stack_ffffffffffffff08);
      CCrypter::~CCrypter(in_stack_fffffffffffffef8);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (bool)(local_99 & 1);
    }
    in_stack_ffffffffffffff08 = in_RSI;
    this_00 = (CWallet *)
              std::_Rb_tree_iterator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>::operator*
                        ((_Rb_tree_iterator<std::pair<const_unsigned_int,_wallet::CMasterKey>_> *)
                         in_stack_fffffffffffffef8);
    in_RSI = in_stack_ffffffffffffff08;
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffff08,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))));
    salt._M_extent._M_extent_value = in_stack_ffffffffffffff78._M_extent_value;
    salt._M_ptr = (pointer)in_stack_ffffffffffffff70._M_extent_value;
    bVar2 = CCrypter::SetKeyFromPassphrase
                      ((CCrypter *)in_RSI,in_stack_ffffffffffffff48,salt,in_stack_ffffffffffffff44,
                       in_stack_ffffffffffffff40);
    if (!bVar2) {
      local_99 = 0;
      iVar3 = 1;
      goto LAB_00ad3818;
    }
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffff08,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT15(in_stack_ffffffffffffff05,in_stack_ffffffffffffff00))));
    ciphertext._M_extent._M_extent_value = in_stack_ffffffffffffff70._M_extent_value;
    ciphertext._M_ptr = in_stack_ffffffffffffff68;
    in_stack_ffffffffffffff07 = CCrypter::Decrypt(this_02,ciphertext,(CKeyingMaterial *)in_RSI);
    if (((bool)in_stack_ffffffffffffff07) &&
       (in_stack_ffffffffffffff06 =
             Unlock(this_00,(CKeyingMaterial *)
                            CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
       (bool)in_stack_ffffffffffffff06)) {
      UpgradeKeyMetadata(in_stack_ffffffffffffff08);
      UpgradeDescriptorCache(this_01);
      local_99 = 1;
      iVar3 = 1;
      goto LAB_00ad3818;
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_int,_wallet::CMasterKey>_> *)
               in_stack_fffffffffffffef8);
  } while( true );
}

Assistant:

bool CWallet::Unlock(const SecureString& strWalletPassphrase)
{
    CCrypter crypter;
    CKeyingMaterial _vMasterKey;

    {
        LOCK(cs_wallet);
        for (const MasterKeyMap::value_type& pMasterKey : mapMasterKeys)
        {
            if(!crypter.SetKeyFromPassphrase(strWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod))
                return false;
            if (!crypter.Decrypt(pMasterKey.second.vchCryptedKey, _vMasterKey))
                continue; // try another master key
            if (Unlock(_vMasterKey)) {
                // Now that we've unlocked, upgrade the key metadata
                UpgradeKeyMetadata();
                // Now that we've unlocked, upgrade the descriptor cache
                UpgradeDescriptorCache();
                return true;
            }
        }
    }
    return false;
}